

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O3

void aalcalcmeanonly::LoadPeriodToWeighting(void)

{
  mapped_type mVar1;
  FILE *__stream;
  size_t sVar2;
  mapped_type *pmVar3;
  Periods p;
  key_type local_24;
  mapped_type local_20;
  
  __stream = fopen("input/periods.bin","rb");
  if (__stream != (FILE *)0x0) {
    sVar2 = fread(&local_24,0xc,1,__stream);
    if (sVar2 != 0) {
      do {
        mVar1 = local_20;
        pmVar3 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)periodToWeighting_,&local_24);
        *pmVar3 = mVar1;
        sVar2 = fread(&local_24,0xc,1,__stream);
      } while (sVar2 != 0);
    }
  }
  return;
}

Assistant:

void LoadPeriodToWeighting() {

    FILE* fin = fopen(PERIODS_FILE, "rb");
    if (fin == nullptr) return;

    Periods p;
    size_t i = fread(&p, sizeof(Periods), 1, fin);
    while (i != 0) {
      periodToWeighting_[p.period_no] = p.weighting;
      i = fread(&p, sizeof(Periods), 1, fin);
    }

  }